

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbustraytypes.cpp
# Opt level: O2

QDBusArgument * operator<<(QDBusArgument *argument,QXdgDBusToolTipStruct *toolTip)

{
  QDBusArgument::beginStructure();
  QDBusArgument::operator<<(argument,(QString *)toolTip);
  operator<<(argument,&toolTip->image);
  QDBusArgument::operator<<(argument,(QString *)&toolTip->title);
  QDBusArgument::operator<<(argument,(QString *)&toolTip->subTitle);
  QDBusArgument::endStructure();
  return argument;
}

Assistant:

const QDBusArgument &operator<<(QDBusArgument &argument, const QXdgDBusToolTipStruct &toolTip)
{
    argument.beginStructure();
    argument << toolTip.icon;
    argument << toolTip.image;
    argument << toolTip.title;
    argument << toolTip.subTitle;
    argument.endStructure();
    return argument;
}